

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_targetCBlockSize
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock)

{
  uint uVar1;
  ZSTD_CCtx *in_RCX;
  long in_RDI;
  void *in_R8;
  undefined4 in_R9D;
  size_t err_code_1;
  size_t err_code;
  size_t bss;
  size_t cSize;
  size_t in_stack_000000b8;
  void *in_stack_000000c0;
  ZSTD_CCtx *in_stack_000000c8;
  size_t sVar2;
  void *src_00;
  undefined4 in_stack_ffffffffffffffc8;
  size_t local_8;
  
  src_00 = (void *)0x0;
  local_8 = ZSTD_buildSeqStore(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  sVar2 = local_8;
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = ZSTD_compressBlock_targetCBlockSize_body
                        (in_RCX,in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffc8),src_00,sVar2,
                         local_8,(U32)in_RDI);
    sVar2 = local_8;
    uVar1 = ERR_isError(local_8);
    if ((uVar1 == 0) && (local_8 = sVar2, *(int *)(*(long *)(in_RDI + 0xc68) + 0x15e4) == 2)) {
      *(undefined4 *)(*(long *)(in_RDI + 0xc68) + 0x15e4) = 1;
    }
  }
  return local_8;
}

Assistant:

static size_t ZSTD_compressBlock_targetCBlockSize(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                               U32 lastBlock)
{
    size_t cSize = 0;
    const size_t bss = ZSTD_buildSeqStore(zc, src, srcSize);
    DEBUGLOG(5, "ZSTD_compressBlock_targetCBlockSize (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u, srcSize=%zu)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit, (unsigned)zc->blockState.matchState.nextToUpdate, srcSize);
    FORWARD_IF_ERROR(bss, "ZSTD_buildSeqStore failed");

    cSize = ZSTD_compressBlock_targetCBlockSize_body(zc, dst, dstCapacity, src, srcSize, bss, lastBlock);
    FORWARD_IF_ERROR(cSize, "ZSTD_compressBlock_targetCBlockSize_body failed");

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}